

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void scale(double *A,int rows,int cols,double alpha)

{
  int local_28;
  int i;
  int N;
  double alpha_local;
  int cols_local;
  int rows_local;
  double *A_local;
  
  for (local_28 = 0; local_28 < rows * cols; local_28 = local_28 + 1) {
    A[local_28] = alpha * A[local_28];
  }
  return;
}

Assistant:

void scale(double *A, int rows, int cols, double alpha) {
	int N,i;
	/*
	 * A = alpha * A
	 * Matrix A is overwritten.
	 */ 
	 
	N = rows * cols;
	
	#pragma omp parallel for
	for (i = 0; i < N;++i) {
		A[i] = alpha * A[i];
	}
}